

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O1

void pystring::os::path::split_posix(string *head,string *tail,string *p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  size_t __n;
  int iVar3;
  bool bVar4;
  string local_70;
  string local_50;
  
  iVar3 = rfind(p,(string *)&forward_slash_abi_cxx11_,0,0x7fffffff);
  slice(&local_70,p,0,iVar3 + 1);
  std::__cxx11::string::operator=((string *)head,(string *)&local_70);
  paVar1 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  slice(&local_70,p,iVar3 + 1,0x7fffffff);
  std::__cxx11::string::operator=((string *)tail,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  sVar2 = head->_M_string_length;
  if (sVar2 != 0) {
    mul(&local_70,(string *)&forward_slash_abi_cxx11_,(int)sVar2);
    __n = head->_M_string_length;
    bVar4 = true;
    if (__n != local_70._M_string_length) goto LAB_00109159;
    if (__n != 0) {
      iVar3 = bcmp((head->_M_dataplus)._M_p,local_70._M_dataplus._M_p,__n);
      bVar4 = iVar3 != 0;
      goto LAB_00109159;
    }
  }
  bVar4 = false;
LAB_00109159:
  if ((sVar2 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    do_strip(&local_50,head,1,(string *)&forward_slash_abi_cxx11_);
    std::__cxx11::string::operator=((string *)head,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void split_posix(std::string & head, std::string & tail, const std::string & p)
    {
        int i = pystring::rfind(p, forward_slash) + 1;
        
        head = pystring::slice(p,0,i);
        tail = pystring::slice(p,i);
        
        if(!head.empty() && (head != pystring::mul(forward_slash, (int) head.size())))
        {
            head = pystring::rstrip(head, forward_slash);
        }
    }